

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

lest * __thiscall lest::to_string<double>(lest *this,double *value)

{
  void *this_00;
  ostringstream local_190 [8];
  ostringstream os;
  double *value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_00 = (void *)std::ostream::operator<<(local_190,std::boolalpha);
  std::ostream::operator<<(this_00,*value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

inline auto to_string( T const & value ) -> ForNonContainerNonPointer<T, std::string>
{
    std::ostringstream os; os << std::boolalpha << value; return os.str();
}